

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O1

void __thiscall SAT::reduceDB(SAT *this)

{
  Clause **ppCVar1;
  Clause *c;
  long lVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar4 = (this->learnts).sz;
  uVar6 = (ulong)uVar4;
  if (uVar6 != 0) {
    ppCVar1 = (this->learnts).data;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::__introsort_loop<Clause**,long,__gnu_cxx::__ops::_Iter_comp_iter<activity_lt>>
              (ppCVar1,ppCVar1 + uVar6,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<Clause**,__gnu_cxx::__ops::_Iter_comp_iter<activity_lt>>
              (ppCVar1,ppCVar1 + uVar6);
  }
  uVar4 = (this->learnts).sz;
  uVar7 = 0;
  uVar6 = 0;
  if (1 < uVar4) {
    uVar7 = 0;
    uVar6 = 0;
    do {
      bVar3 = locked(this,(this->learnts).data[uVar7]);
      ppCVar1 = (this->learnts).data;
      c = ppCVar1[uVar7];
      if (bVar3) {
        ppCVar1[uVar6] = c;
        uVar6 = (ulong)((int)uVar6 + 1);
      }
      else {
        removeClause(this,c);
      }
      uVar7 = uVar7 + 1;
      uVar4 = (this->learnts).sz;
    } while (uVar7 < uVar4 >> 1);
  }
  uVar5 = (uint)uVar6;
  if ((uint)uVar7 < uVar4) {
    uVar7 = uVar7 & 0xffffffff;
    do {
      ppCVar1 = (this->learnts).data;
      uVar5 = (int)uVar6 + 1;
      ppCVar1[uVar6] = ppCVar1[uVar7];
      uVar7 = uVar7 + 1;
      uVar6 = (ulong)uVar5;
    } while (uVar4 != uVar7);
  }
  (this->learnts).sz = uVar5;
  if (0 < so.verbosity) {
    printf("%% Pruned %d learnt clauses\n",(ulong)((int)uVar7 - uVar5));
    return;
  }
  return;
}

Assistant:

void SAT::reduceDB() {
	unsigned int i;
	unsigned int j;

	std::sort((Clause**)learnts, (Clause**)learnts + learnts.size(), activity_lt());

	for (i = j = 0; i < learnts.size() / 2; i++) {
		if (!locked(*learnts[i])) {
			removeClause(*learnts[i]);
		} else {
			learnts[j++] = learnts[i];
		}
	}
	for (; i < learnts.size(); i++) {
		learnts[j++] = learnts[i];
	}
	learnts.resize(j);

	if (so.verbosity >= 1) {
		printf("%% Pruned %d learnt clauses\n", i - j);
	}
}